

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQuery::removeAllQueryItems(QUrlQuery *this,QString *key)

{
  Map *this_00;
  pair<QString,_QString> *ppVar1;
  long lVar2;
  bool bVar3;
  QUrlQueryPrivate *this_01;
  iterator aend;
  iterator iVar4;
  long lVar5;
  pair<QString,_QString> *ppVar6;
  long lVar7;
  pair<QString,_QString> *s1;
  type __p;
  const_iterator abegin;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr == (QUrlQueryPrivate *)0x0) goto LAB_002486f7;
  this_01 = QSharedDataPointer<QUrlQueryPrivate>::data(&this->d);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QUrlQueryPrivate::recodeFromUser((QString *)&local_58,this_01,key);
  this_00 = &this_01->itemList;
  ppVar1 = (this_01->itemList).d.ptr;
  lVar2 = (this_01->itemList).d.size;
  lVar5 = lVar2 * 0x30;
  s1 = ppVar1;
  for (lVar7 = lVar2 >> 2; ppVar6 = s1, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar3 = ::comparesEqual(&s1->first,(QString *)&local_58);
    if (bVar3) goto LAB_00248684;
    bVar3 = ::comparesEqual(&s1[1].first,(QString *)&local_58);
    ppVar6 = s1 + 1;
    if (bVar3) goto LAB_00248684;
    bVar3 = ::comparesEqual(&s1[2].first,(QString *)&local_58);
    ppVar6 = s1 + 2;
    if (bVar3) goto LAB_00248684;
    bVar3 = ::comparesEqual(&s1[3].first,(QString *)&local_58);
    ppVar6 = s1 + 3;
    if (bVar3) goto LAB_00248684;
    s1 = s1 + 4;
    lVar5 = lVar5 + -0xc0;
  }
  lVar5 = lVar5 / 0x30;
  if (lVar5 == 1) {
LAB_00248734:
    bVar3 = ::comparesEqual(&s1->first,(QString *)&local_58);
    ppVar6 = ppVar1 + lVar2;
    if (bVar3) {
      ppVar6 = s1;
    }
  }
  else if (lVar5 == 2) {
LAB_00248659:
    bVar3 = ::comparesEqual(&ppVar6->first,(QString *)&local_58);
    if (!bVar3) {
      s1 = ppVar6 + 1;
      goto LAB_00248734;
    }
  }
  else {
    ppVar6 = ppVar1 + lVar2;
    if ((lVar5 == 3) &&
       (bVar3 = ::comparesEqual(&s1->first,(QString *)&local_58), ppVar6 = s1, !bVar3)) {
      ppVar6 = s1 + 1;
      goto LAB_00248659;
    }
  }
LAB_00248684:
  if (((long)ppVar6 - (long)ppVar1) / 0x30 != (this_01->itemList).d.size) {
    aend = QList<std::pair<QString,_QString>_>::end(this_00);
    iVar4 = QList<std::pair<QString,_QString>_>::begin(this_00);
    __p = (type)((long)iVar4.i + ((long)ppVar6 - (long)ppVar1));
    abegin.i = __p;
    while (__p = __p + 1, __p != aend.i) {
      bVar3 = ::comparesEqual(&__p->first,(QString *)&local_58);
      if (!bVar3) {
        std::pair<QString,_QString>::operator=(abegin.i,__p);
        abegin.i = abegin.i + 1;
      }
    }
    QList<std::pair<QString,_QString>_>::erase(this_00,abegin,(const_iterator)aend.i);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
LAB_002486f7:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlQuery::removeAllQueryItems(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        const QString encodedKey = p->recodeFromUser(key);
        auto firstEqualsEncodedKey = [&encodedKey](const std::pair<QString, QString> &item) {
            return item.first == encodedKey;
        };
        p->itemList.removeIf(firstEqualsEncodedKey);
    }
}